

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat32x4OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDFloat32x4Operation::OpFromFloat64x2(SIMDValue *value)

{
  _x86_SIMDValue _Var1;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar2;
  double dStack_58;
  X86SIMDValue v;
  X86SIMDValue x86Result;
  SIMDValue *value_local;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(value);
  dStack_58 = _Var1.field_0._0_8_;
  v.field_0.i64[0] = _Var1.field_0._8_8_;
  v.field_0.i64[1] = CONCAT44((float)v.field_0.f64[0],(float)dStack_58);
  aVar2 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&v.field_0 + 8));
  return (SIMDValue)aVar2;
}

Assistant:

SIMDValue SIMDFloat32x4Operation::OpFromFloat64x2(const SIMDValue& value)
    {
        X86SIMDValue x86Result;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        // Converts the two double-precision, floating-point values of v.m128d_value
        // to single-precision, floating-point values.
        x86Result.m128_value = _mm_cvtpd_ps(v.m128d_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }